

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

AttVal * prvTidyRepairAttrValue(TidyDocImpl *doc,Node *node,ctmbstr name,ctmbstr value)

{
  AttVal *pAVar1;
  tmbstr ptVar2;
  
  pAVar1 = prvTidyGetAttrByName(node,name);
  if (pAVar1 != (AttVal *)0x0) {
    if (pAVar1->value != (tmbstr)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,pAVar1->value);
    }
    if (value == (ctmbstr)0x0) {
      ptVar2 = (tmbstr)0x0;
    }
    else {
      ptVar2 = prvTidytmbstrdup(doc->allocator,value);
    }
    pAVar1->value = ptVar2;
    return pAVar1;
  }
  pAVar1 = prvTidyAddAttribute(doc,node,name,value);
  return pAVar1;
}

Assistant:

AttVal* TY_(RepairAttrValue)(TidyDocImpl* doc, Node* node, ctmbstr name, ctmbstr value)
{
    AttVal* old = TY_(GetAttrByName)(node, name);

    if (old)
    {
        if (old->value)
            TidyDocFree(doc, old->value);
        if (value)
            old->value = TY_(tmbstrdup)(doc->allocator, value);
        else
            old->value = NULL;

        return old;
    }
    else
        return TY_(AddAttribute)(doc, node, name, value);
}